

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

HttpHeaderId __thiscall kj::HttpHeaderTable::Builder::add(Builder *this,StringPtr name)

{
  HttpHeaderTable *pHVar1;
  _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  Builder *pBVar2;
  __node_ptr __node;
  __hash_code __c;
  __node_ptr p_Var3;
  ulong __bkt;
  __node_ptr p_Var4;
  pair<kj::StringPtr,_unsigned_long> *__args;
  size_type in_R8;
  HttpHeaderId HVar5;
  StringPtr name_00;
  _Scoped_node local_70;
  Builder *local_60;
  StringPtr local_58;
  pair<kj::StringPtr,_unsigned_long> local_48;
  
  name_00.content.size_ = (char *)name.content.size_;
  local_58.content.ptr = name.content.ptr;
  name_00.content.ptr = name_00.content.size_;
  local_58.content.size_ = (size_t)name_00.content.size_;
  anon_unknown_36::requireValidHeaderName((anon_unknown_36 *)local_58.content.ptr,name_00);
  pHVar1 = (this->table).ptr;
  this_00 = (_Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(pHVar1->idsByName).ptr;
  local_48.second =
       (long)(pHVar1->namesById).builder.pos - (long)(pHVar1->namesById).builder.ptr >> 4;
  __args = &local_48;
  local_48.first.content.ptr = local_58.content.ptr;
  local_48.first.content.size_ = local_58.content.size_;
  local_70._M_h = (__hashtable_alloc *)this_00;
  local_60 = this;
  __node = std::__detail::
           _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<kj::StringPtr_const,unsigned_int>,true>>>
           ::_M_allocate_node<std::pair<kj::StringPtr,unsigned_long>>
                     ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<kj::StringPtr_const,unsigned_int>,true>>>
                       *)this_00,__args);
  local_70._M_node = __node;
  __c = std::__detail::
        _Hash_code_base<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
        ::_M_hash_code((_Hash_code_base<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                        *)&__node->
                           super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>
                       ,&__args->first);
  __bkt = __c % this_00->_M_bucket_count;
  p_Var3 = std::
           _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(this_00,__bkt,
                          (key_type *)
                          &__node->
                           super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>
                          ,__c);
  p_Var4 = p_Var3;
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(this_00,__bkt,__c,__node,in_R8);
    local_70._M_node = (__node_ptr)0x0;
    p_Var4 = __node;
  }
  std::
  _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_70);
  pBVar2 = local_60;
  if (p_Var3 == (__node_ptr)0x0) {
    Vector<kj::StringPtr>::add<kj::StringPtr&>(&((local_60->table).ptr)->namesById,&local_58);
  }
  HVar5.id = *(undefined4 *)
              ((long)&(p_Var4->
                      super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>).
                      super__Hash_node_value_base<std::pair<const_kj::StringPtr,_unsigned_int>_>.
                      _M_storage._M_storage + 0x10);
  HVar5.table = (pBVar2->table).ptr;
  HVar5._12_4_ = 0;
  return HVar5;
}

Assistant:

HttpHeaderId HttpHeaderTable::Builder::add(kj::StringPtr name) {
  requireValidHeaderName(name);

  auto insertResult = table->idsByName->map.insert(std::make_pair(name, table->namesById.size()));
  if (insertResult.second) {
    table->namesById.add(name);
  }
  return HttpHeaderId(table, insertResult.first->second);
}